

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int session_set_incoming_window(SESSION_HANDLE session,uint32_t incoming_window)

{
  if (session != (SESSION_HANDLE)0x0) {
    session->desired_incoming_window = incoming_window;
    session->incoming_window = incoming_window;
    return 0;
  }
  return 0x3d2;
}

Assistant:

int session_set_incoming_window(SESSION_HANDLE session, uint32_t incoming_window)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        session_instance->desired_incoming_window = incoming_window;
        session_instance->incoming_window = incoming_window;

        result = 0;
    }

    return result;
}